

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

int lyht_find_first(hash_table *ht,uint32_t hash,ht_rec **rec_p)

{
  uint idx_00;
  bool bVar1;
  ht_rec *local_50;
  uint local_3c;
  uint32_t idx;
  uint32_t i;
  ht_rec *inval_rec;
  ht_rec *rec;
  ht_rec **rec_p_local;
  uint32_t hash_local;
  hash_table *ht_local;
  
  _idx = (ht_rec *)0x0;
  if (rec_p != (ht_rec **)0x0) {
    *rec_p = (ht_rec *)0x0;
  }
  idx_00 = hash & ht->size - 1;
  inval_rec = lyht_get_rec(ht->recs,ht->rec_size,idx_00);
  local_3c = idx_00;
  while( true ) {
    bVar1 = false;
    if ((inval_rec->hits != 0) && (bVar1 = true, inval_rec->hits != -1)) {
      bVar1 = (inval_rec->hash & ht->size - 1) != idx_00;
    }
    if (!bVar1) {
      if (inval_rec->hits == 0) {
        if (rec_p != (ht_rec **)0x0) {
          if (_idx == (ht_rec *)0x0) {
            local_50 = inval_rec;
          }
          else {
            local_50 = _idx;
          }
          *rec_p = local_50;
        }
        return 1;
      }
      if (_idx != (ht_rec *)0x0) {
        memcpy(_idx,inval_rec,(ulong)ht->rec_size);
        inval_rec->hits = -1;
        inval_rec = _idx;
      }
      if (rec_p != (ht_rec **)0x0) {
        *rec_p = inval_rec;
      }
      return 0;
    }
    if ((inval_rec->hits == -1) && (_idx == (ht_rec *)0x0)) {
      _idx = inval_rec;
    }
    local_3c = (local_3c + 1) % ht->size;
    if (local_3c == idx_00) break;
    inval_rec = lyht_get_rec(ht->recs,ht->rec_size,local_3c);
  }
  if (_idx != (ht_rec *)0x0) {
    if (rec_p != (ht_rec **)0x0) {
      *rec_p = _idx;
    }
    return 1;
  }
  __assert_fail("inval_rec",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                ,0x1a3,"int lyht_find_first(struct hash_table *, uint32_t, struct ht_rec **)");
}

Assistant:

static int
lyht_find_first(struct hash_table *ht, uint32_t hash, struct ht_rec **rec_p)
{
    struct ht_rec *rec, *inval_rec = NULL;
    uint32_t i, idx;

    if (rec_p) {
        *rec_p = NULL;
    }

    idx = i = hash & (ht->size - 1);
    rec = lyht_get_rec(ht->recs, ht->rec_size, idx);

    /* skip through overflow and deleted records */
    while ((rec->hits != 0) && ((rec->hits == -1) || ((rec->hash & (ht->size - 1)) != idx))) {
        if ((rec->hits == -1) && !inval_rec) {
            /* remember the first invalid record we found while searching for this hash */
            inval_rec = rec;
        }
        i = (i + 1) % ht->size;
        if (i == idx) {
            /* we went through all the records (very unlikely, but possible when many records are invalid),
             * just return not found */
            assert(inval_rec);
            if (rec_p) {
                *rec_p = inval_rec;
            }
            return 1;
        }
        rec = lyht_get_rec(ht->recs, ht->rec_size, i);
    }

    if (rec->hits == 0) {
        /* we could not find the value */
        if (rec_p) {
            /* return the first empty (or invalid) record found */
            *rec_p = inval_rec ? inval_rec : rec;
        }
        return 1;
    }

    /* we have found a record with equal (shortened) hash,
     * move it to the first invalid record so that the next search is faster */
    if (inval_rec) {
        memcpy(inval_rec, rec, ht->rec_size);
        rec->hits = -1;
        rec = inval_rec;
    }
    if (rec_p) {
        *rec_p = rec;
    }
    return 0;
}